

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_harbor.c
# Opt level: O3

int remote_send_handle(harbor *h,uint32_t source,uint32_t destination,int type,int session,char *msg
                      ,size_t sz)

{
  int fd;
  int iVar1;
  skynet_context *context;
  harbor_msg_queue *queue;
  harbor_msg *phVar2;
  uint uVar3;
  remote_message_header cookie;
  undefined4 uVar4;
  harbor_msg local_50;
  
  uVar3 = destination >> 0x18;
  context = h->ctx;
  if (uVar3 == h->id) {
    skynet_send(context,source,destination,type | 0x10000,session,msg,sz);
  }
  else {
    fd = h->s[uVar3].fd;
    iVar1 = h->s[uVar3].status;
    local_50.header.source = source;
    local_50.header.session = session;
    if (fd == 0) {
      if (iVar1 == 4) {
        uVar4 = 0;
        skynet_send(context,destination,source,7,0,(void *)0x0,0);
        skynet_error(context,"Drop message to harbor %d from %x to %x (session = %d, msgsz = %d)",
                     (ulong)uVar3,(ulong)source,(ulong)destination,(ulong)(uint)session,
                     CONCAT44(uVar4,(int)sz));
        return 0;
      }
    }
    else if (iVar1 != 1) {
      local_50.header.destination = type << 0x18 | destination & 0xffffff;
      send_remote(context,fd,msg,sz,&local_50.header);
      return 0;
    }
    queue = h->s[uVar3].queue;
    if (queue == (harbor_msg_queue *)0x0) {
      queue = (harbor_msg_queue *)malloc(0x18);
      queue->size = 0x400;
      queue->head = 0;
      queue->tail = 0;
      phVar2 = (harbor_msg *)malloc(0x8000);
      queue->data = phVar2;
      h->s[uVar3].queue = queue;
    }
    local_50.header.destination = destination & 0xffffff | type << 0x18;
    local_50.size = sz;
    local_50.buffer = msg;
    push_queue_msg(queue,&local_50);
  }
  return 1;
}

Assistant:

static int
remote_send_handle(struct harbor *h, uint32_t source, uint32_t destination, int type, int session, const char * msg, size_t sz) {
	int harbor_id = destination >> HANDLE_REMOTE_SHIFT;
	struct skynet_context * context = h->ctx;
	if (harbor_id == h->id) {
		// local message
		skynet_send(context, source, destination , type | PTYPE_TAG_DONTCOPY, session, (void *)msg, sz);
		return 1;
	}

	struct slave * s = &h->s[harbor_id];
	if (s->fd == 0 || s->status == STATUS_HANDSHAKE) {
		if (s->status == STATUS_DOWN) {
			// throw an error return to source
			// report the destination is dead
			skynet_send(context, destination, source, PTYPE_ERROR, 0 , NULL, 0);
			skynet_error(context, "Drop message to harbor %d from %x to %x (session = %d, msgsz = %d)",harbor_id, source, destination,session,(int)sz);
		} else {
			if (s->queue == NULL) {
				s->queue = new_queue();
			}
			struct remote_message_header header;
			header.source = source;
			header.destination = (type << HANDLE_REMOTE_SHIFT) | (destination & HANDLE_MASK);
			header.session = (uint32_t)session;
			push_queue(s->queue, (void *)msg, sz, &header);
			return 1;
		}
	} else {
		struct remote_message_header cookie;
		cookie.source = source;
		cookie.destination = (destination & HANDLE_MASK) | ((uint32_t)type << HANDLE_REMOTE_SHIFT);
		cookie.session = (uint32_t)session;
		send_remote(context, s->fd, msg,sz,&cookie);
	}

	return 0;
}